

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int MRIStepReInit(void *arkode_mem,ARKRhsFn fse,ARKRhsFn fsi,realtype t0,N_Vector y0)

{
  int iVar1;
  SUNNonlinearSolver NLS;
  char *pcVar2;
  int iVar4;
  ulong uVar3;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_50;
  ARKodeMRIStepMem local_48;
  realtype local_40;
  ARKodeMRIStepMem local_38;
  
  local_40 = t0;
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepReInit",&local_50,&local_38);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (local_50->MallocDone == 0) {
    pcVar2 = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
    iVar4 = -0x17;
  }
  else {
    auVar7._0_4_ = -(uint)((int)fse == 0);
    iVar4 = (int)((ulong)fse >> 0x20);
    auVar7._4_4_ = -(uint)(iVar4 == 0);
    auVar7._8_4_ = -(uint)((int)fsi == 0);
    iVar5 = (int)((ulong)fsi >> 0x20);
    auVar7._12_4_ = -(uint)(iVar5 == 0);
    auVar6._4_4_ = auVar7._0_4_;
    auVar6._0_4_ = auVar7._4_4_;
    auVar6._8_4_ = auVar7._12_4_;
    auVar6._12_4_ = auVar7._8_4_;
    iVar1 = movmskpd(0,auVar6 & auVar7);
    if (iVar1 == 3) {
      pcVar2 = "Must specify at least one of fe, fi (both NULL).";
    }
    else {
      if (y0 != (N_Vector)0x0) {
        uVar3 = ~(CONCAT44(-(uint)((int)fsi == 0),-(uint)((int)fse == 0)) &
                 CONCAT44(-(uint)(iVar5 == 0),-(uint)(iVar4 == 0))) & (ulong)DAT_0066b800;
        local_38->explicit_rhs = (int)uVar3;
        local_38->implicit_rhs = (int)(uVar3 >> 0x20);
        if (((auVar6 & auVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (local_38->NLS == (SUNNonlinearSolver)0x0)) {
          NLS = SUNNonlinSol_Newton(y0,local_50->sunctx);
          if (NLS == (SUNNonlinearSolver)0x0) {
            pcVar2 = "Error creating default Newton solver";
          }
          else {
            iVar1 = MRIStepSetNonlinearSolver(local_50,NLS);
            if (iVar1 == 0) {
              local_38->ownNLS = 1;
              goto LAB_003e733c;
            }
            pcVar2 = "Error attaching default Newton solver";
          }
          arkProcessError(local_50,-0x14,"ARKode::MRIStep","MRIStepReInit",pcVar2);
          MRIStepFree(&local_50);
          return -0x14;
        }
LAB_003e733c:
        local_48 = local_38;
        iVar1 = arkInit((ARKodeMem)arkode_mem,local_40,y0,0);
        if (iVar1 != 0) {
          arkProcessError(local_50,iVar1,"ARKode::MRIStep","MRIStepReInit",
                          "Unable to reinitialize main ARKode infrastructure");
          return iVar1;
        }
        local_48->fse = fse;
        local_48->fsi = fsi;
        local_48->nstlp = 0;
        local_48->nfse = 0;
        local_48->nfsi = 0;
        local_48->nsetups = 0;
        local_48->nls_iters = 0;
        return 0;
      }
      pcVar2 = "y0 = NULL illegal.";
    }
    iVar1 = -0x16;
    iVar4 = -0x16;
  }
  arkProcessError(local_50,iVar4,"ARKode::MRIStep","MRIStepReInit",pcVar2);
  return iVar1;
}

Assistant:

int MRIStepReInit(void* arkode_mem, ARKRhsFn fse, ARKRhsFn fsi, realtype t0,
                  N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that at least one of fse, fsi is supplied and is to be used */
  if (fse == NULL && fsi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit_rhs = (fse == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit_rhs = (fsi == NULL) ? SUNFALSE : SUNTRUE;

  /* Create a default Newton NLS object (just in case; will be deleted if
     the user attaches a nonlinear solver) */
  if (step_mem->implicit_rhs && !(step_mem->NLS)) {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (!NLS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepReInit", "Error creating default Newton solver");
      MRIStepFree((void**) &ark_mem); return(ARK_MEM_FAIL);
    }
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepReInit", "Error attaching default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* ReInitialize main ARKode infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepReInit",
                    "Unable to reinitialize main ARKode infrastructure");
    return(retval);
  }

  /* Copy the input parameters into ARKode state */
  step_mem->fse = fse;
  step_mem->fsi = fsi;

  /* Initialize all the counters */
  step_mem->nfse      = 0;
  step_mem->nfsi      = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;

  return(ARK_SUCCESS);
}